

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O3

void __thiscall SongListModel::SongListModel(SongListModel *this,Module *mod,QObject *parent)

{
  undefined4 *puVar1;
  code *local_60;
  ImplFn local_58;
  code *local_50;
  undefined8 local_48;
  QObject local_40 [8];
  QObject local_38 [8];
  
  QAbstractListModel::QAbstractListModel(&this->super_QAbstractListModel,parent);
  *(undefined ***)this = &PTR_metaObject_001fcb28;
  this->mModule = mod;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSongData).
  super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = Module::reloaded;
  local_48 = 0;
  local_60 = reload;
  local_58 = (ImplFn)0x0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QSlotObject<void_(SongListModel::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar1 + 4) = reload;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)mod,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_50 = Module::aboutToSave;
  local_48 = 0;
  local_60 = commit;
  local_58 = (ImplFn)0x0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QSlotObject<void_(SongListModel::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar1 + 4) = commit;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)mod,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  reload(this);
  return;
}

Assistant:

SongListModel::SongListModel(Module &mod, QObject *parent) :
    QAbstractListModel(parent),
    mModule(mod),
    mSongData()
{
    connect(&mod, &Module::reloaded, this, &SongListModel::reload);
    connect(&mod, &Module::aboutToSave, this, &SongListModel::commit);
    reload();
}